

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O3

void ON_Sort(sort_algorithm method,uint *index,void *data,size_t count,size_t sizeof_element,
            _func_int_void_ptr_void_ptr_void_ptr *compar,void *p)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  uint local_84;
  void *local_50;
  void *local_48;
  undefined8 local_40;
  _func_int_void_ptr_void_ptr_void_ptr *local_38;
  
  auVar4 = _DAT_0069b170;
  auVar3 = _DAT_0069b160;
  auVar2 = _DAT_0069b120;
  if (sizeof_element == 0 || (index == (uint *)0x0 || count == 0)) {
    return;
  }
  if (count == 1) {
    *index = 0;
    return;
  }
  iVar12 = (int)count;
  if (iVar12 != 0) {
    lVar6 = (count & 0xffffffff) - 1;
    auVar13._8_4_ = (int)lVar6;
    auVar13._0_8_ = lVar6;
    auVar13._12_4_ = (int)((ulong)lVar6 >> 0x20);
    iVar5 = (int)sizeof_element;
    uVar9 = 0;
    auVar13 = auVar13 ^ _DAT_0069b120;
    uVar10 = 0;
    do {
      auVar15._8_4_ = (int)uVar10;
      auVar15._0_8_ = uVar10;
      auVar15._12_4_ = (int)(uVar10 >> 0x20);
      auVar16 = (auVar15 | auVar4) ^ auVar2;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        index[uVar10] = uVar9;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        index[uVar10 + 1] = iVar5 + uVar9;
      }
      auVar15 = (auVar15 | auVar3) ^ auVar2;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        index[uVar10 + 2] = iVar5 * 2 + uVar9;
        index[uVar10 + 3] = iVar5 * 3 + uVar9;
      }
      uVar10 = uVar10 + 4;
      uVar9 = uVar9 + iVar5 * 4;
    } while (((count & 0xffffffff) + 3 & 0xfffffffffffffffc) != uVar10);
  }
  local_40 = 0;
  local_50 = p;
  local_48 = data;
  local_38 = compar;
  if (method != quick_sort) {
    uVar10 = count >> 1 & 0x7fffffff;
    uVar9 = iVar12 - 1;
    do {
      if ((int)uVar10 == 0) {
        local_84 = index[uVar9];
        index[uVar9] = *index;
        uVar10 = 0;
        uVar9 = uVar9 - 1;
        if (uVar9 == 0) goto LAB_004ee19b;
      }
      else {
        uVar10 = (ulong)((int)uVar10 - 1);
        local_84 = index[uVar10];
      }
      uVar7 = (int)uVar10 * 2;
      uVar11 = uVar10;
      if (uVar7 < uVar9) {
        uVar7 = uVar7 | 1;
        do {
          if ((uVar7 < uVar9) &&
             (iVar5 = (*compar)((void *)((ulong)index[uVar7] + (long)data),
                                (void *)((ulong)index[(ulong)uVar7 + 1] + (long)data),p), iVar5 < 0)
             ) {
            uVar7 = uVar7 + 1;
          }
          iVar5 = (*compar)((void *)((ulong)local_84 + (long)data),
                            (void *)((ulong)index[uVar7] + (long)data),p);
          uVar8 = (uint)uVar11;
          uVar1 = uVar9;
          if (iVar5 < 0) {
            index[uVar11] = index[uVar7];
            uVar8 = uVar7;
            uVar1 = uVar7 * 2;
          }
          uVar7 = uVar1 + 1;
          uVar11 = (ulong)uVar8;
        } while (uVar7 <= uVar9);
      }
      index[uVar11] = local_84;
    } while( true );
  }
  ON_qsort(index,count,4,qicompar3,&local_50);
LAB_004ee1a7:
  if (iVar12 != 0) {
    lVar6 = 0;
    do {
      index[lVar6] = (uint)((ulong)index[lVar6] / (sizeof_element & 0xffffffff));
      lVar6 = lVar6 + 1;
    } while (iVar12 != (int)lVar6);
  }
  return;
LAB_004ee19b:
  *index = local_84;
  goto LAB_004ee1a7;
}

Assistant:

void
ON_Sort( ON::sort_algorithm method, 
  unsigned int* index, 
  const void* data, 
  size_t count, 
  size_t sizeof_element, 
  int (*compar)(const void*,const void*,void*),
  void* p
  )
{
  tagON_SORT_CONTEXT context;
  unsigned int* idx;
  const void* tmp;
  unsigned int i, j, k, tmpi, icount, isizeof_element;
  
  if (count < 1 || 0 == index || sizeof_element <= 0) 
  {
    return;
  }
  if (1 == count) 
  {
    index[0]=0;
    return;
  }

  isizeof_element = (unsigned int)sizeof_element; // (int) converts 64 bit size_t
  icount = (unsigned int)count;
  idx = index;
  
  for ( i = 0; icount--; i += isizeof_element )
  {
    *idx++ = i;
  }

  memset(&context,0,sizeof(context));
  context.users_context = p;
  context.qdata = (const unsigned char*)data;
  context.compar3 = compar;
  idx = index;
  if ( ON::sort_algorithm::quick_sort == method )
  {
    ON_qsort(idx,count,sizeof(idx[0]),qicompar3,&context);
  }
  else
  {
    // heap sort
    icount = (unsigned int)count;

    k = icount >> 1;
    icount--;
    for (;;) 
    {
      if (k) 
      {
        tmpi = idx[--k];
        tmp  = context.qdata + tmpi;
      }
      else 
      {
        tmpi = idx[icount];
        tmp  = context.qdata + tmpi;
        idx[icount] = idx[0];
        if (!(--icount)) 
        {
          idx[0] = tmpi;
          break;
        }
      }
      i = k;
      j = (k<<1) + 1;
      while (j <= icount) 
      {
        if (j < icount && context.compar3(context.qdata + idx[j], context.qdata + idx[j+1], context.users_context) < 0) 
        {
          j++;
        }
        if (context.compar3(tmp,context.qdata + idx[j], context.users_context) < 0) 
        {
          idx[i] = idx[j];
          i = j;
          j = (j<<1) + 1;
        } 
        else 
        {
          j = icount + 1;
        }
      }
      idx[i] = tmpi;
    }
  }

  for (i = (unsigned int)count; i--; idx++ )
  {
    *idx /= isizeof_element;
  }
}